

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_auto_ptr.hxx
# Opt level: O0

void __thiscall
cm::auto_ptr<cmRulePlaceholderExpander>::~auto_ptr(auto_ptr<cmRulePlaceholderExpander> *this)

{
  cmRulePlaceholderExpander *this_00;
  auto_ptr<cmRulePlaceholderExpander> *this_local;
  
  this_00 = this->x_;
  if (this_00 != (cmRulePlaceholderExpander *)0x0) {
    cmRulePlaceholderExpander::~cmRulePlaceholderExpander(this_00);
    operator_delete(this_00,0xc0);
  }
  return;
}

Assistant:

~auto_ptr() throw()
  {
    // Assume object destructor is nothrow.
    delete this->x_;
  }